

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::makepoint(tetgenmesh *this,point *pnewpoint,verttype vtype)

{
  point pdVar1;
  long lVar2;
  
  pdVar1 = (point)memorypool::alloc(this->points);
  *pnewpoint = pdVar1;
  if (0 < (long)this->numpointattrib) {
    memset(pdVar1 + 3,0,(long)this->numpointattrib << 3);
  }
  if (0 < (long)this->sizeoftensor) {
    memset(pdVar1 + this->pointmtrindex,0,(long)this->sizeoftensor << 3);
  }
  lVar2 = (long)this->point2simindex;
  pdVar1[lVar2] = 0.0;
  (*pnewpoint)[lVar2 + 1] = 0.0;
  if ((((this->b->plc != 0) || (this->b->refine != 0)) &&
      ((*pnewpoint)[lVar2 + 2] = 0.0, this->b->metric != 0)) && (this->bgm != (tetgenmesh *)0x0)) {
    (*pnewpoint)[lVar2 + 3] = 0.0;
  }
  pdVar1 = *pnewpoint;
  *(uint *)((long)pdVar1 + (long)this->pointmarkindex * 4) =
       (int)this->points->items - (uint)(this->in->firstnumber == 0);
  *(undefined4 *)((long)pdVar1 + (long)this->pointmarkindex * 4 + 4) = 0;
  *(verttype *)((long)pdVar1 + (long)this->pointmarkindex * 4 + 4) =
       (uint)*(byte *)((long)pdVar1 + (long)this->pointmarkindex * 4 + 4) | vtype << 8;
  return;
}

Assistant:

void tetgenmesh::makepoint(point* pnewpoint, enum verttype vtype)
{
  int i;

  *pnewpoint = (point) points->alloc();

  // Initialize the point attributes.
  for (i = 0; i < numpointattrib; i++) {
    (*pnewpoint)[3 + i] = 0.0;
  }
  // Initialize the metric tensor.
  for (i = 0; i < sizeoftensor; i++) {
    (*pnewpoint)[pointmtrindex + i] = 0.0;
  }
  setpoint2tet(*pnewpoint, NULL);
  setpoint2ppt(*pnewpoint, NULL);
  if (b->plc || b->refine) {
    // Initialize the point-to-simplex field.
    setpoint2sh(*pnewpoint, NULL);
    if (b->metric && (bgm != NULL)) {
      setpoint2bgmtet(*pnewpoint, NULL);
    }
  }
  // Initialize the point marker (starting from in->firstnumber).
  setpointmark(*pnewpoint, (int) (points->items) - (!in->firstnumber));
  // Clear all flags.
  ((int *) (*pnewpoint))[pointmarkindex + 1] = 0;
  // Initialize (set) the point type. 
  setpointtype(*pnewpoint, vtype);
}